

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,unsigned_long>
          (Thread *this)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  unsigned_long *__first;
  unsigned_long *__last;
  unsigned_long local_28;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  unsigned_long val;
  Thread *this_local;
  
  result.v[1] = Pop<unsigned_long>(this);
  __first = std::begin<unsigned_long,2ul>((unsigned_long (*) [2])&local_28);
  __last = std::end<unsigned_long,2ul>((unsigned_long (*) [2])&local_28);
  std::fill<unsigned_long*,unsigned_long>(__first,__last,result.v + 1);
  value.v[1] = result.v[0];
  value.v[0] = local_28;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}